

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O0

string * __thiscall
glcts::(anonymous_namespace)::DrawIndirectBase::AccessToString_abi_cxx11_
          (string *__return_storage_ptr__,DrawIndirectBase *this,GLbitfield access)

{
  runtime_error *this_00;
  allocator<char> local_2e;
  allocator<char> local_2d [16];
  allocator<char> local_1d;
  GLbitfield local_1c;
  DrawIndirectBase *pDStack_18;
  GLbitfield access_local;
  DrawIndirectBase *this_local;
  
  local_1c = access;
  pDStack_18 = this;
  this_local = (DrawIndirectBase *)__return_storage_ptr__;
  if (access == 35000) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"GL_READ_ONLY",local_2d);
    std::allocator<char>::~allocator(local_2d);
  }
  else if (access == 0x88b9) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"GL_WRITE_ONLY",&local_2e);
    std::allocator<char>::~allocator(&local_2e);
  }
  else {
    if (access != 0x88ba) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Invalid access type!");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"GL_READ_WRITE",&local_1d);
    std::allocator<char>::~allocator(&local_1d);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AccessToString(GLbitfield access)
	{
		switch (access)
		{
		case GL_READ_WRITE:
			return "GL_READ_WRITE";
			break;
		case GL_READ_ONLY:
			return "GL_READ_ONLY";
			break;
		case GL_WRITE_ONLY:
			return "GL_WRITE_ONLY";
			break;
		default:
			throw std::runtime_error("Invalid access type!");
			break;
		}
	}